

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_id_map_alloc(nng_id_map **map,uint64_t lo,uint64_t hi,int flags)

{
  nni_id_map *m_00;
  nng_id_map *m;
  int flags_local;
  uint64_t hi_local;
  uint64_t lo_local;
  nng_id_map **map_local;
  
  m_00 = (nni_id_map *)nni_zalloc(0x38);
  if (m_00 == (nni_id_map *)0x0) {
    map_local._4_4_ = 2;
  }
  else {
    nni_id_map_init(m_00,lo,hi,(flags & 1U) != 0);
    *map = (nng_id_map *)m_00;
    map_local._4_4_ = 0;
  }
  return map_local._4_4_;
}

Assistant:

int
nng_id_map_alloc(nng_id_map **map, uint64_t lo, uint64_t hi, int flags)
{
	nng_id_map *m;

	if ((m = NNI_ALLOC_STRUCT(m)) == NULL) {
		return (NNG_ENOMEM);
	}
	nni_id_map_init(
	    &m->m, lo, hi, (flags & NNG_MAP_RANDOM) ? true : false);
	*map = m;
	return (0);
}